

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int FnNoise5_float(float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngood,
                  float *minval,float *maxval,double *noise2,double *noise3,double *noise5,
                  int *status)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  int extraout_EAX;
  double *arr;
  double *arr_00;
  double *arr_01;
  double *__ptr;
  double *__base;
  double *__base_00;
  size_t sVar4;
  double *extraout_RAX;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  int n;
  long lVar10;
  size_t __nmemb;
  float *pfVar11;
  size_t __nmemb_00;
  double dVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float local_d4;
  size_t local_80;
  size_t local_78;
  
  lVar6 = 1;
  __nmemb_00 = ny;
  if (nx < 9) {
    __nmemb_00 = 1;
    lVar6 = ny;
  }
  __nmemb = lVar6 * nx;
  if ((long)__nmemb < 9) {
    if ((long)__nmemb < 1) {
      fVar17 = -3.4028235e+38;
      fVar24 = 3.4028235e+38;
      arr = (double *)0x0;
    }
    else {
      fVar24 = 3.4028235e+38;
      fVar17 = -3.4028235e+38;
      lVar6 = 0;
      arr = (double *)0x0;
      do {
        fVar13 = array[lVar6];
        if (nullcheck == 0) {
LAB_001f687f:
          fVar16 = fVar13;
          if (fVar24 <= fVar13) {
            fVar16 = fVar24;
          }
          if (fVar13 <= fVar17) {
            fVar13 = fVar17;
          }
          fVar17 = fVar13;
          arr = (double *)((long)arr + 1);
          fVar24 = fVar16;
        }
        else if ((fVar13 != nullvalue) || (NAN(fVar13) || NAN(nullvalue))) goto LAB_001f687f;
        lVar6 = lVar6 + 1;
      } while (__nmemb - lVar6 != 0);
    }
    if (minval != (float *)0x0) {
      *minval = fVar24;
    }
    if (maxval != (float *)0x0) {
      *maxval = fVar17;
    }
    if (ngood != (long *)0x0) {
      *ngood = (long)arr;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = 0.0;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = 0.0;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = 0.0;
    }
  }
  else {
    bVar2 = minval != (float *)0x0;
    bVar3 = maxval != (float *)0x0;
    arr = (double *)calloc(__nmemb,4);
    if (arr != (double *)0x0) {
      arr_00 = (double *)calloc(__nmemb,4);
      if (arr_00 != (double *)0x0) {
        arr_01 = (double *)calloc(__nmemb,4);
        if (arr_01 == (double *)0x0) {
          free(arr);
          arr = arr_00;
        }
        else {
          __ptr = (double *)calloc(__nmemb_00,8);
          if (__ptr == (double *)0x0) {
            free(arr);
            free(arr_00);
            arr = arr_01;
          }
          else {
            __base = (double *)calloc(__nmemb_00,8);
            if (__base == (double *)0x0) {
              free(arr);
              free(arr_00);
              free(arr_01);
              arr = __ptr;
            }
            else {
              __base_00 = (double *)calloc(__nmemb_00,8);
              if (__base_00 != (double *)0x0) {
                if ((long)__nmemb_00 < 1) {
                  fVar24 = -3.4028235e+38;
                  local_d4 = 3.4028235e+38;
                  dVar15 = 0.0;
                  lVar6 = 0;
                  dVar14 = 0.0;
                  dVar12 = 0.0;
                }
                else {
                  local_d4 = 3.4028235e+38;
                  fVar24 = -3.4028235e+38;
                  sVar9 = 0;
                  local_78 = 0;
                  local_80 = 0;
                  lVar5 = 0;
                  pfVar11 = array;
                  do {
                    sVar4 = 0;
                    lVar6 = lVar5;
                    if (nullcheck == 0) {
LAB_001f6a14:
                      if (sVar4 != __nmemb) {
                        lVar7 = sVar9 * __nmemb;
                        fVar17 = array[lVar7 + sVar4];
                        if (bVar2 || bVar3) {
                          fVar13 = fVar17;
                          if (local_d4 <= fVar17) {
                            fVar13 = local_d4;
                          }
                          local_d4 = fVar13;
                          if (fVar24 < fVar17) {
                            fVar24 = fVar17;
                          }
                        }
                        sVar4 = sVar4 + 1;
                        lVar6 = lVar5 + 1;
                        if ((long)sVar4 < (long)__nmemb && nullcheck != 0) {
                          do {
                            if ((pfVar11[sVar4] != nullvalue) ||
                               (NAN(pfVar11[sVar4]) || NAN(nullvalue))) goto LAB_001f6a86;
                            sVar4 = sVar4 + 1;
                          } while (__nmemb - sVar4 != 0);
                        }
                        else {
LAB_001f6a86:
                          if (sVar4 != __nmemb) {
                            fVar13 = array[lVar7 + sVar4];
                            if (bVar2 || bVar3) {
                              fVar16 = fVar13;
                              if (local_d4 <= fVar13) {
                                fVar16 = local_d4;
                              }
                              local_d4 = fVar16;
                              if (fVar24 < fVar13) {
                                fVar24 = fVar13;
                              }
                            }
                            sVar4 = sVar4 + 1;
                            lVar6 = lVar5 + 2;
                            if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar4)) {
LAB_001f6ae1:
                              if (sVar4 != __nmemb) {
                                fVar16 = array[lVar7 + sVar4];
                                if (bVar2 || bVar3) {
                                  fVar18 = fVar16;
                                  if (local_d4 <= fVar16) {
                                    fVar18 = local_d4;
                                  }
                                  local_d4 = fVar18;
                                  if (fVar24 < fVar16) {
                                    fVar24 = fVar16;
                                  }
                                }
                                sVar4 = sVar4 + 1;
                                lVar6 = lVar5 + 3;
                                if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar4)) {
LAB_001f6b36:
                                  if (sVar4 != __nmemb) {
                                    fVar18 = array[lVar7 + sVar4];
                                    if (bVar2 || bVar3) {
                                      fVar19 = fVar18;
                                      if (local_d4 <= fVar18) {
                                        fVar19 = local_d4;
                                      }
                                      local_d4 = fVar19;
                                      if (fVar24 < fVar18) {
                                        fVar24 = fVar18;
                                      }
                                    }
                                    sVar4 = sVar4 + 1;
                                    lVar6 = lVar5 + 4;
                                    if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar4)) {
LAB_001f6ba8:
                                      if (sVar4 != __nmemb) {
                                        fVar19 = array[lVar7 + sVar4];
                                        if (bVar2 || bVar3) {
                                          fVar20 = fVar19;
                                          if (local_d4 <= fVar19) {
                                            fVar20 = local_d4;
                                          }
                                          local_d4 = fVar20;
                                          if (fVar24 < fVar19) {
                                            fVar24 = fVar19;
                                          }
                                        }
                                        sVar4 = sVar4 + 1;
                                        lVar6 = lVar5 + 5;
                                        if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar4)) {
LAB_001f6bfc:
                                          if (sVar4 != __nmemb) {
                                            fVar20 = array[lVar7 + sVar4];
                                            if (bVar2 || bVar3) {
                                              fVar21 = fVar20;
                                              if (local_d4 <= fVar20) {
                                                fVar21 = local_d4;
                                              }
                                              local_d4 = fVar21;
                                              if (fVar24 < fVar20) {
                                                fVar24 = fVar20;
                                              }
                                            }
                                            sVar4 = sVar4 + 1;
                                            lVar6 = lVar5 + 6;
                                            if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar4))
                                            {
LAB_001f6c5a:
                                              if (sVar4 != __nmemb) {
                                                fVar21 = array[lVar7 + sVar4];
                                                if (bVar2 || bVar3) {
                                                  fVar22 = fVar21;
                                                  if (local_d4 <= fVar21) {
                                                    fVar22 = local_d4;
                                                  }
                                                  local_d4 = fVar22;
                                                  if (fVar24 < fVar21) {
                                                    fVar24 = fVar21;
                                                  }
                                                }
                                                sVar4 = sVar4 + 1;
                                                lVar6 = lVar5 + 7;
                                                if ((nullcheck == 0) ||
                                                   ((long)__nmemb <= (long)sVar4)) {
LAB_001f6cb1:
                                                  if (sVar4 != __nmemb) {
                                                    fVar22 = array[lVar7 + sVar4];
                                                    if (bVar2 || bVar3) {
                                                      fVar23 = fVar22;
                                                      if (local_d4 <= fVar22) {
                                                        fVar23 = local_d4;
                                                      }
                                                      local_d4 = fVar23;
                                                      if (fVar24 < fVar22) {
                                                        fVar24 = fVar22;
                                                      }
                                                    }
                                                    lVar5 = lVar5 + 8;
                                                    sVar4 = sVar4 + 1;
                                                    lVar6 = lVar5;
                                                    if ((long)sVar4 < (long)__nmemb) {
                                                      lVar10 = 0;
                                                      lVar8 = 0;
                                                      do {
                                                        fVar23 = fVar18;
                                                        if ((nullcheck != 0) &&
                                                           ((long)sVar4 < (long)__nmemb)) {
                                                          while( true ) {
                                                            if ((pfVar11[sVar4] != nullvalue) ||
                                                               (NAN(pfVar11[sVar4]) ||
                                                                NAN(nullvalue))) break;
                                                            sVar4 = sVar4 + 1;
                                                            if (__nmemb - sVar4 == 0)
                                                            goto LAB_001f6e3a;
                                                          }
                                                        }
                                                        if (sVar4 == __nmemb) break;
                                                        fVar1 = array[lVar7 + sVar4];
                                                        if (bVar2 || bVar3) {
                                                          fVar18 = fVar1;
                                                          if (local_d4 <= fVar1) {
                                                            fVar18 = local_d4;
                                                          }
                                                          local_d4 = fVar18;
                                                          if (fVar24 < fVar1) {
                                                            fVar24 = fVar1;
                                                          }
                                                        }
                                                        if (fVar19 == fVar20) {
                                                          if ((fVar20 != fVar21) ||
                                                             (NAN(fVar20) || NAN(fVar21)))
                                                          goto LAB_001f6d9b;
                                                        }
                                                        else {
LAB_001f6d9b:
                                                          *(float *)((long)arr + lVar8 * 4) =
                                                               ABS(fVar19 - fVar21);
                                                          lVar8 = lVar8 + 1;
                                                        }
                                                        if ((((fVar16 != fVar23) ||
                                                             (fVar23 != fVar19)) ||
                                                            (fVar19 != fVar20)) ||
                                                           ((fVar20 != fVar21 ||
                                                            (NAN(fVar20) || NAN(fVar21))))) {
                                                          *(float *)((long)arr_00 + lVar10 * 4) =
                                                               ABS(((fVar19 + fVar19) - fVar16) -
                                                                   fVar21);
                                                          *(float *)((long)arr_01 + lVar10 * 4) =
                                                               ABS(fVar17 + fVar21 * -4.0 +
                                                                            fVar19 * 6.0 +
                                                                            fVar16 * -4.0 + fVar1);
                                                          lVar10 = lVar10 + 1;
                                                        }
                                                        else {
                                                          lVar5 = lVar5 + 1;
                                                        }
                                                        sVar4 = sVar4 + 1;
                                                        fVar18 = fVar19;
                                                        fVar19 = fVar20;
                                                        fVar20 = fVar21;
                                                        fVar21 = fVar22;
                                                        fVar22 = fVar1;
                                                        fVar17 = fVar13;
                                                        fVar13 = fVar16;
                                                        fVar16 = fVar23;
                                                      } while ((long)sVar4 < (long)__nmemb);
LAB_001f6e3a:
                                                      lVar6 = lVar5 + lVar10;
                                                      if (lVar10 != 0) {
                                                        if (lVar10 == 1) {
                                                          if (lVar8 == 1) {
                                                            __ptr[local_80] = (double)*(float *)arr;
                                                            local_80 = local_80 + 1;
                                                          }
                                                          __base[local_78] =
                                                               (double)*(float *)arr_00;
                                                          fVar17 = *(float *)arr_01;
                                                        }
                                                        else {
                                                          n = (int)lVar10;
                                                          if (1 < lVar8) {
                                                            fVar17 = quick_select_float((float *)arr
                                                                                        ,n);
                                                            __ptr[local_80] = (double)fVar17;
                                                            local_80 = local_80 + 1;
                                                          }
                                                          fVar17 = quick_select_float((float *)
                                                  arr_00,n);
                                                  __base[local_78] = (double)fVar17;
                                                  fVar17 = quick_select_float((float *)arr_01,n);
                                                  }
                                                  __base_00[local_78] = (double)fVar17;
                                                  local_78 = local_78 + 1;
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  do {
                                                    if ((pfVar11[sVar4] != nullvalue) ||
                                                       (NAN(pfVar11[sVar4]) || NAN(nullvalue)))
                                                    goto LAB_001f6cb1;
                                                    sVar4 = sVar4 + 1;
                                                  } while (__nmemb - sVar4 != 0);
                                                }
                                              }
                                            }
                                            else {
                                              do {
                                                if ((pfVar11[sVar4] != nullvalue) ||
                                                   (NAN(pfVar11[sVar4]) || NAN(nullvalue)))
                                                goto LAB_001f6c5a;
                                                sVar4 = sVar4 + 1;
                                              } while (__nmemb - sVar4 != 0);
                                            }
                                          }
                                        }
                                        else {
                                          do {
                                            if ((pfVar11[sVar4] != nullvalue) ||
                                               (NAN(pfVar11[sVar4]) || NAN(nullvalue)))
                                            goto LAB_001f6bfc;
                                            sVar4 = sVar4 + 1;
                                          } while (__nmemb - sVar4 != 0);
                                        }
                                      }
                                    }
                                    else {
                                      do {
                                        if ((pfVar11[sVar4] != nullvalue) ||
                                           (NAN(pfVar11[sVar4]) || NAN(nullvalue)))
                                        goto LAB_001f6ba8;
                                        sVar4 = sVar4 + 1;
                                      } while (__nmemb - sVar4 != 0);
                                    }
                                  }
                                }
                                else {
                                  do {
                                    if ((pfVar11[sVar4] != nullvalue) ||
                                       (NAN(pfVar11[sVar4]) || NAN(nullvalue))) goto LAB_001f6b36;
                                    sVar4 = sVar4 + 1;
                                  } while (__nmemb - sVar4 != 0);
                                }
                              }
                            }
                            else {
                              do {
                                if ((pfVar11[sVar4] != nullvalue) ||
                                   (NAN(pfVar11[sVar4]) || NAN(nullvalue))) goto LAB_001f6ae1;
                                sVar4 = sVar4 + 1;
                              } while (__nmemb - sVar4 != 0);
                            }
                          }
                        }
                      }
                    }
                    else {
                      do {
                        if ((pfVar11[sVar4] != nullvalue) || (NAN(pfVar11[sVar4]) || NAN(nullvalue))
                           ) goto LAB_001f6a14;
                        sVar4 = sVar4 + 1;
                      } while (__nmemb - sVar4 != 0);
                    }
                    sVar9 = sVar9 + 1;
                    pfVar11 = pfVar11 + __nmemb;
                    lVar5 = lVar6;
                  } while (sVar9 != __nmemb_00);
                  dVar14 = 0.0;
                  dVar15 = 0.0;
                  if (local_78 != 0) {
                    if (local_78 == 1) {
                      dVar14 = *__base;
                      dVar15 = *__base_00;
                    }
                    else {
                      qsort(__base,local_78,8,FnCompare_double);
                      qsort(__base_00,local_78,8,FnCompare_double);
                      lVar5 = ((local_78 - ((long)(local_78 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe)
                              * 4;
                      lVar7 = (local_78 - ((long)local_78 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                      dVar14 = (*(double *)((long)__base + lVar5) +
                               *(double *)((long)__base + lVar7)) * 0.5;
                      dVar15 = (*(double *)((long)__base_00 + lVar5) +
                               *(double *)((long)__base_00 + lVar7)) * 0.5;
                    }
                  }
                  dVar12 = 0.0;
                  if (local_80 != 0) {
                    if (local_80 == 1) {
                      dVar12 = *__ptr;
                    }
                    else {
                      qsort(__ptr,local_80,8,FnCompare_double);
                      dVar12 = (*(double *)
                                 ((long)__ptr +
                                 ((local_80 - ((long)(local_80 - 1) >> 0x3f)) - 1 &
                                 0xfffffffffffffffe) * 4) +
                               *(double *)
                                ((long)__ptr +
                                (local_80 - ((long)local_80 >> 0x3f) & 0xfffffffffffffffe) * 4)) *
                               0.5;
                    }
                  }
                }
                if (ngood != (long *)0x0) {
                  *ngood = lVar6;
                }
                if (minval != (float *)0x0) {
                  *minval = local_d4;
                }
                if (maxval != (float *)0x0) {
                  *maxval = fVar24;
                }
                if (noise2 != (double *)0x0) {
                  *noise2 = dVar12 * 1.0483579;
                }
                if (noise3 != (double *)0x0) {
                  *noise3 = dVar14 * 0.6052697;
                }
                if (noise5 != (double *)0x0) {
                  *noise5 = dVar15 * 0.1772048;
                }
                free(__base_00);
                free(__base);
                free(__ptr);
                free(arr_01);
                free(arr_00);
                free(arr);
                return extraout_EAX;
              }
              free(arr);
              free(arr_00);
              free(arr_01);
              free(__ptr);
              arr = __base;
            }
          }
        }
      }
      free(arr);
      arr = extraout_RAX;
    }
    *status = 0x71;
  }
  return (int)arr;
}

Assistant:

static int FnNoise5_float
       (float *array,       /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
        long ny,            /* number of rows in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */
   /* returned parameters */   
	long *ngood,        /* number of good, non-null pixels? */
	float *minval,    /* minimum non-null value */
	float *maxval,    /* maximum non-null value */
	double *noise2,      /* returned 2nd order MAD of all non-null pixels */
	double *noise3,      /* returned 3rd order MAD of all non-null pixels */
	double *noise5,      /* returned 5th order MAD of all non-null pixels */
	int *status)        /* error status */

/*
Estimate the median and background noise in the input image using 2nd, 3rd and 5th
order Median Absolute Differences.

The noise in the background of the image is calculated using the MAD algorithms 
developed for deriving the signal to noise ratio in spectra
(see issue #42 of the ST-ECF newsletter, http://www.stecf.org/documents/newsletter/)

3rd order:  noise = 1.482602 / sqrt(6) * median (abs(2*flux(i) - flux(i-2) - flux(i+2)))

The returned estimates are the median of the values that are computed for each 
row of the image.
*/
{
	long ii, jj, nrows = 0, nrows2 = 0, nvals, nvals2, ngoodpix = 0;
	float *differences2, *differences3, *differences5;
	float *rowpix, v1, v2, v3, v4, v5, v6, v7, v8, v9;
	float xminval = FLT_MAX, xmaxval = -FLT_MAX;
	int do_range = 0;
	double *diffs2, *diffs3, *diffs5; 
	double xnoise2 = 0, xnoise3 = 0, xnoise5 = 0;
	
	if (nx < 9) {
		/* treat entire array as an image with a single row */
		nx = nx * ny;
		ny = 1;
	}

	/* rows must have at least 9 pixels */
	if (nx < 9) {

		for (ii = 0; ii < nx; ii++) {
		    if (nullcheck && array[ii] == nullvalue)
		        continue;
		    else {
			if (array[ii] < xminval) xminval = array[ii];
			if (array[ii] > xmaxval) xmaxval = array[ii];
			ngoodpix++;
		    }
		}
		if (minval) *minval = xminval;
		if (maxval) *maxval = xmaxval;
		if (ngood) *ngood = ngoodpix;
		if (noise2) *noise2 = 0.;
		if (noise3) *noise3 = 0.;
		if (noise5) *noise5 = 0.;
		return(*status);
	}

	/* do we need to compute the min and max value? */
	if (minval || maxval) do_range = 1;
	
        /* allocate arrays used to compute the median and noise estimates */
	differences2 = calloc(nx, sizeof(float));
	if (!differences2) {
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences3 = calloc(nx, sizeof(float));
	if (!differences3) {
		free(differences2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences5 = calloc(nx, sizeof(float));
	if (!differences5) {
		free(differences2);
		free(differences3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs2 = calloc(ny, sizeof(double));
	if (!diffs2) {
		free(differences2);
		free(differences3);
		free(differences5);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs3 = calloc(ny, sizeof(double));
	if (!diffs3) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs5 = calloc(ny, sizeof(double));
	if (!diffs5) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
		free(diffs3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* loop over each row of the image */
	for (jj=0; jj < ny; jj++) {

                rowpix = array + (jj * nx); /* point to first pixel in the row */

		/***** find the first valid pixel in row */
		ii = 0;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v1 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v1 < xminval) xminval = v1;
			if (v1 > xmaxval) xmaxval = v1;
		}

		/***** find the 2nd valid pixel in row (which we will skip over) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v2 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;
		
		if (do_range) {
			if (v2 < xminval) xminval = v2;
			if (v2 > xmaxval) xmaxval = v2;
		}

		/***** find the 3rd valid pixel in row */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v3 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v3 < xminval) xminval = v3;
			if (v3 > xmaxval) xmaxval = v3;
		}
				
		/* find the 4nd valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v4 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v4 < xminval) xminval = v4;
			if (v4 > xmaxval) xmaxval = v4;
		}
			
		/* find the 5th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v5 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v5 < xminval) xminval = v5;
			if (v5 > xmaxval) xmaxval = v5;
		}
				
		/* find the 6th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v6 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v6 < xminval) xminval = v6;
			if (v6 > xmaxval) xmaxval = v6;
		}
				
		/* find the 7th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v7 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v7 < xminval) xminval = v7;
			if (v7 > xmaxval) xmaxval = v7;
		}
				
		/* find the 8th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v8 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v8 < xminval) xminval = v8;
			if (v8 > xmaxval) xmaxval = v8;
		}
		/* now populate the differences arrays */
		/* for the remaining pixels in the row */
		nvals = 0;
		nvals2 = 0;
		for (ii++; ii < nx; ii++) {

		    /* find the next valid pixel in row */
                    if (nullcheck)
		        while (ii < nx && rowpix[ii] == nullvalue) ii++;
		     
		    if (ii == nx) break;  /* hit end of row */
		    v9 = rowpix[ii];  /* store the good pixel value */

		    if (do_range) {
			if (v9 < xminval) xminval = v9;
			if (v9 > xmaxval) xmaxval = v9;
		    }

		    /* construct array of absolute differences */

		    if (!(v5 == v6 && v6 == v7) ) {
		        differences2[nvals2] = (float) fabs(v5 - v7);
			nvals2++;
		    }

		    if (!(v3 == v4 && v4 == v5 && v5 == v6 && v6 == v7) ) {
		        differences3[nvals] = (float) fabs((2 * v5) - v3 - v7);
		        differences5[nvals] = (float) fabs((6 * v5) - (4 * v3) - (4 * v7) + v1 + v9);
		        nvals++;  
		    } else {
		        /* ignore constant background regions */
			ngoodpix++;
		    }

		    /* shift over 1 pixel */
		    v1 = v2;
		    v2 = v3;
		    v3 = v4;
		    v4 = v5;
		    v5 = v6;
		    v6 = v7;
		    v7 = v8;
		    v8 = v9;
	        }  /* end of loop over pixels in the row */

		/* compute the median diffs */
		/* Note that there are 8 more pixel values than there are diffs values. */
		ngoodpix += nvals;

		if (nvals == 0) {
		    continue;  /* cannot compute medians on this row */
		} else if (nvals == 1) {
		    if (nvals2 == 1) {
		        diffs2[nrows2] = differences2[0];
			nrows2++;
		    }
		        
		    diffs3[nrows] = differences3[0];
		    diffs5[nrows] = differences5[0];
		} else {
                    /* quick_select returns the median MUCH faster than using qsort */
		    if (nvals2 > 1) {
                        diffs2[nrows2] = quick_select_float(differences2, nvals);
			nrows2++;
		    }

                    diffs3[nrows] = quick_select_float(differences3, nvals);
                    diffs5[nrows] = quick_select_float(differences5, nvals);
		}

		nrows++;
	}  /* end of loop over rows */

	    /* compute median of the values for each row */
	if (nrows == 0) { 
	       xnoise3 = 0;
	       xnoise5 = 0;
	} else if (nrows == 1) {
	       xnoise3 = diffs3[0];
	       xnoise5 = diffs5[0];
	} else {	    
	       qsort(diffs3, nrows, sizeof(double), FnCompare_double);
	       qsort(diffs5, nrows, sizeof(double), FnCompare_double);
	       xnoise3 =  (diffs3[(nrows - 1)/2] + diffs3[nrows/2]) / 2.;
	       xnoise5 =  (diffs5[(nrows - 1)/2] + diffs5[nrows/2]) / 2.;
	}

	if (nrows2 == 0) { 
	       xnoise2 = 0;
	} else if (nrows2 == 1) {
	       xnoise2 = diffs2[0];
	} else {	    
	       qsort(diffs2, nrows2, sizeof(double), FnCompare_double);
	       xnoise2 =  (diffs2[(nrows2 - 1)/2] + diffs2[nrows2/2]) / 2.;
	}

	if (ngood)  *ngood  = ngoodpix;
	if (minval) *minval = xminval;
	if (maxval) *maxval = xmaxval;
	if (noise2)  *noise2  = 1.0483579 * xnoise2;
	if (noise3)  *noise3  = 0.6052697 * xnoise3;
	if (noise5)  *noise5  = 0.1772048 * xnoise5;

	free(diffs5);
	free(diffs3);
	free(diffs2);
	free(differences5);
	free(differences3);
	free(differences2);

	return(*status);
}